

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  TestProperty *this;
  char *pcVar4;
  long in_FS_OFFSET;
  TestProperty *property;
  int i;
  TestResult *result_local;
  ostream *stream_local;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [8];
  string kProperty;
  string kProperties;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kProperty.field_2._M_local_buf + 8),"properties",
             (allocator<char> *)((long)&stream_local + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"property",(allocator<char> *)((long)&stream_local + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 6));
  iVar2 = TestResult::test_property_count(result);
  if (0 < iVar2) {
    poVar3 = std::operator<<(stream,"<");
    poVar3 = std::operator<<(poVar3,(string *)(kProperty.field_2._M_local_buf + 8));
    std::operator<<(poVar3,">\n");
    for (property._4_4_ = 0; iVar2 = TestResult::test_property_count(result), property._4_4_ < iVar2
        ; property._4_4_ = property._4_4_ + 1) {
      this = TestResult::GetTestProperty(result,property._4_4_);
      poVar3 = std::operator<<(stream,"<");
      std::operator<<(poVar3,local_50);
      poVar3 = std::operator<<(stream," name=\"");
      pcVar4 = TestProperty::key(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar4,(allocator<char> *)((long)&stream_local + 5));
      EscapeXmlAttribute(&local_70,&local_90);
      poVar3 = std::operator<<(poVar3,(string *)&local_70);
      std::operator<<(poVar3,"\"");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 5));
      poVar3 = std::operator<<(stream," value=\"");
      pcVar4 = TestProperty::value(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,pcVar4,(allocator<char> *)((long)&stream_local + 4));
      EscapeXmlAttribute(&local_b0,&local_d0);
      poVar3 = std::operator<<(poVar3,(string *)&local_b0);
      std::operator<<(poVar3,"\"");
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 4));
      std::operator<<(stream,"/>\n");
    }
    poVar3 = std::operator<<(stream,"</");
    poVar3 = std::operator<<(poVar3,(string *)(kProperty.field_2._M_local_buf + 8));
    std::operator<<(poVar3,">\n");
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(kProperty.field_2._M_local_buf + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "<" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "<" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "</" << kProperties << ">\n";
}